

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rawbin.c
# Opt level: O0

void rawbin_writeexec(GlobalVars *gv,FILE *f,bool singlefile,char header)

{
  bool bVar1;
  GlobalVars *pGVar2;
  int in_EDX;
  FILE *in_RSI;
  LinkedSection *in_RDI;
  GlobalVars *unaff_retaddr;
  char *name;
  LinkedSection *prevls;
  LinkedSection *ls;
  unsigned_long addr;
  bool firstsec;
  FILE *firstfile;
  long in_stack_000003c8;
  FILE *in_stack_000003d0;
  void *in_stack_ffffffffffffffa8;
  FILE *in_stack_ffffffffffffffb0;
  FILE *in_stack_ffffffffffffffb8;
  GlobalVars *in_stack_ffffffffffffffc0;
  char *local_30;
  FILE *local_10;
  
  bVar1 = true;
  local_10 = in_RSI;
  do {
    do {
      pGVar2 = (GlobalVars *)get_next_section(in_stack_ffffffffffffffc0);
      if (pGVar2 == (GlobalVars *)0x0) {
LAB_0013c0e3:
        if ((local_10 != (FILE *)0x0) && (local_10 != in_RSI)) {
          fclose(local_10);
        }
        return;
      }
    } while (((pGVar2->osec_base_name == (char *)0x0) ||
             (((ulong)(pGVar2->inputlist).dummy & 0x100) == 0)) ||
            (((ulong)(pGVar2->inputlist).last & 1) != 0));
    calc_relocs(unaff_retaddr,in_RDI);
    if (*(int *)&(in_RDI->relocs).last == 0) {
      if (bVar1) {
        if ((in_RDI->xrefs).last != (node *)0x0) {
          fprintf((FILE *)(in_RDI->xrefs).last,"Base address = 0x%08lx.\n",
                  (pGVar2->flavours).flavour_dir);
        }
        bVar1 = false;
        rawbin_writeheader(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                           (LinkedSection *)in_stack_ffffffffffffffb0,
                           (char)((ulong)in_stack_ffffffffffffffa8 >> 0x38));
      }
      else if (local_30 < (pGVar2->flavours).flavour_dir) {
        if (((ulong)((long)(pGVar2->flavours).flavour_dir - (long)local_30) < 0x10) || (in_EDX != 0)
           ) {
          fwritegap(in_stack_000003d0,in_stack_000003c8);
        }
        else {
          if (local_10 != in_RSI) {
            fclose(local_10);
          }
          in_stack_ffffffffffffffa8 = (void *)strlen((char *)in_RDI->base);
          strlen((char *)(pGVar2->inputlist).first);
          in_stack_ffffffffffffffb8 = (FILE *)alloc((size_t)in_stack_ffffffffffffffb0);
          sprintf((char *)in_stack_ffffffffffffffb8,"%s.%s",in_RDI->base,(pGVar2->inputlist).first);
          local_10 = fopen((char *)in_stack_ffffffffffffffb8,"wb");
          if (local_10 == (FILE *)0x0) {
            error(0x1d,in_stack_ffffffffffffffb8);
            goto LAB_0013c0e3;
          }
          free(in_stack_ffffffffffffffb8);
          rawbin_writeheader(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                             (LinkedSection *)in_stack_ffffffffffffffb0,
                             (char)((ulong)in_stack_ffffffffffffffa8 >> 0x38));
        }
      }
      else if ((pGVar2->flavours).flavour_dir < local_30) {
        error(0x62,fff[(byte)in_RDI->filesize]->tname,(pGVar2->inputlist).first,
              (in_stack_ffffffffffffffc0->inputlist).first);
      }
    }
    else {
      if ((in_RDI->xrefs).last != (node *)0x0) {
        fprintf((FILE *)(in_RDI->xrefs).last,"Base address section %s = 0x%08lx.\n",
                (pGVar2->inputlist).first,(pGVar2->flavours).flavour_dir);
      }
      if (local_10 != (FILE *)0x0) {
        fclose(local_10);
      }
      if (in_RDI->size == 0) {
        in_stack_ffffffffffffffb8 = (FILE *)(pGVar2->inputlist).first;
      }
      else {
        in_stack_ffffffffffffffb0 = (FILE *)strlen((char *)in_RDI->size);
        strlen((char *)(pGVar2->inputlist).first);
        in_stack_ffffffffffffffb8 = (FILE *)alloc((size_t)in_stack_ffffffffffffffb0);
        sprintf((char *)in_stack_ffffffffffffffb8,"%s.%s",in_RDI->size,(pGVar2->inputlist).first);
      }
      local_10 = fopen((char *)in_stack_ffffffffffffffb8,"wb");
      if (local_10 == (FILE *)0x0) {
        error(0x1d,in_stack_ffffffffffffffb8);
        goto LAB_0013c0e3;
      }
      if (in_RDI->size != 0) {
        free(in_stack_ffffffffffffffb8);
      }
      rawbin_writeheader(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                         (LinkedSection *)in_stack_ffffffffffffffb0,
                         (char)((ulong)in_stack_ffffffffffffffa8 >> 0x38));
    }
    fwritex(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,0x13c08d);
    if (*(char **)&pGVar2->dest_format < pGVar2->osec_base_name) {
      fwritegap(in_stack_000003d0,in_stack_000003c8);
    }
    local_30 = (pGVar2->flavours).flavour_dir + (long)pGVar2->osec_base_name;
    in_stack_ffffffffffffffc0 = pGVar2;
  } while( true );
}

Assistant:

static void rawbin_writeexec(struct GlobalVars *gv,FILE *f,bool singlefile,
                             char header)
/* creates executable raw-binary files (with absolute addresses) */
{
  FILE *firstfile = f;
  bool firstsec = TRUE;
  unsigned long addr;
  struct LinkedSection *ls,*prevls;
  char *name;

  while (ls = get_next_section(gv)) {
    if (ls->size==0 || !(ls->flags & SF_ALLOC) || (ls->ld_flags & LSF_NOLOAD))
      continue;  /* ignore empty sections */

    /* resolve all relocations */
    calc_relocs(gv,ls);

    if (gv->output_sections) {
      /* make a new file for each output section */
      if (gv->trace_file)
        fprintf(gv->trace_file,"Base address section %s = 0x%08lx.\n",
                ls->name,ls->copybase);
      if (f != NULL)
        fclose(f);
      if (gv->osec_base_name != NULL) {
        /* use a common base name before the section name */
        name = alloc(strlen(gv->osec_base_name)+strlen(ls->name)+2);
        sprintf(name,"%s.%s",gv->osec_base_name,ls->name);
      }
      else
        name = (char *)ls->name;
      if (!(f = fopen(name,"wb"))) {
        error(29,name);
        break;
      }
      if (gv->osec_base_name != NULL)
        free(name);
      rawbin_writeheader(gv,f,ls,header);
    }
    else if (firstsec) {
      if (gv->trace_file)
        fprintf(gv->trace_file,"Base address = 0x%08lx.\n",ls->copybase);
      firstsec = FALSE;
      rawbin_writeheader(gv,f,ls,header);
    }
    else {
      /* handle gaps between this and the previous section */
      if (ls->copybase > addr) {
        if (ls->copybase-addr < MAXGAP || singlefile) {
          fwritegap(f,ls->copybase-addr);
        }
        else {  /* open a new file for this section */
          if (f != firstfile)
            fclose(f);
          name = alloc(strlen(gv->dest_name)+strlen(ls->name)+2);
          sprintf(name,"%s.%s",gv->dest_name,ls->name);
          if (!(f = fopen(name,"wb"))) {
            error(29,name);
            break;
          }
          free(name);
          rawbin_writeheader(gv,f,ls,header);
        }
      }
      else if (ls->copybase < addr)
        error(98,fff[gv->dest_format]->tname,ls->name,prevls->name);
    }

    /* write section contents */
    fwritex(f,ls->data,ls->filesize);
    if (ls->filesize < ls->size)
      fwritegap(f,ls->size - ls->filesize);

    addr = ls->copybase + ls->size;
    prevls = ls;
  }

  if (f!=NULL && f!=firstfile)
    fclose(f);
}